

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  int iVar1;
  CURLcode CVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ssize_t bytes_written;
  pollfd pfd [1];
  ssize_t local_40;
  pollfd local_38;
  
  if (nread < 1) {
    lVar3 = 0;
  }
  else {
    lVar5 = 0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (ulong)(buffer[lVar5] == -1);
      lVar5 = lVar5 + 1;
    } while (nread != lVar5);
  }
  lVar5 = lVar3 + nread;
  pcVar4 = buffer;
  if (lVar3 != 0) {
    pcVar4 = (char *)(*Curl_cmalloc)(lVar5 + 1);
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    lVar3 = 0;
    if (0 < nread) {
      lVar6 = 0;
      do {
        pcVar4[lVar3] = buffer[lVar6];
        if (buffer[lVar6] == -1) {
          pcVar4[lVar3 + 1] = -1;
          lVar3 = lVar3 + 2;
        }
        else {
          lVar3 = lVar3 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (nread != lVar6);
    }
    pcVar4[lVar3] = '\0';
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (lVar5 < 1) {
    CVar2 = CURLE_OK;
  }
  else {
    lVar3 = 0;
    do {
      local_38.fd = conn->sock[0];
      local_38.events = 4;
      iVar1 = Curl_poll(&local_38,1,-1);
      CVar2 = CURLE_SEND_ERROR;
      if (1 < iVar1 + 1U) {
        local_40 = 0;
        CVar2 = Curl_write(conn,conn->sock[0],pcVar4 + lVar3,lVar5 - lVar3,&local_40);
        lVar3 = lVar3 + local_40;
      }
    } while ((CVar2 == CURLE_OK) && (lVar3 < lVar5));
  }
  if (pcVar4 != buffer) {
    (*Curl_cfree)(pcVar4);
  }
  return CVar2;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  ssize_t escapes, i, outlen;
  unsigned char *outbuf = NULL;
  CURLcode result = CURLE_OK;
  ssize_t bytes_written, total_written;

  /* Determine size of new buffer after escaping */
  escapes = 0;
  for(i = 0; i < nread; i++)
    if((unsigned char)buffer[i] == CURL_IAC)
      escapes++;
  outlen = nread + escapes;

  if(outlen == nread)
    outbuf = (unsigned char *)buffer;
  else {
    ssize_t j;
    outbuf = malloc(nread + escapes + 1);
    if(!outbuf)
      return CURLE_OUT_OF_MEMORY;

    j = 0;
    for(i = 0; i < nread; i++) {
      outbuf[j++] = buffer[i];
      if((unsigned char)buffer[i] == CURL_IAC)
        outbuf[j++] = CURL_IAC;
    }
    outbuf[j] = '\0';
  }

  total_written = 0;
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                            outbuf + total_written,
                            outlen - total_written,
                            &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  /* Free malloc copy if escaped */
  if(outbuf != (unsigned char *)buffer)
    free(outbuf);

  return result;
}